

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_string.cc
# Opt level: O2

void SplitStringToSetUsing
               (string *full,char *delim,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  char c;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  allocator local_76;
  allocator local_75;
  Logger local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (delim == (char *)0x0) {
    local_74.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,&local_75);
    std::__cxx11::string::string((string *)&local_50,"SplitStringToSetUsing",&local_76);
    poVar4 = Logger::Start(ERR,&local_70,0x3e,&local_50);
    poVar4 = std::operator<<(poVar4,"CHECK failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3e);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"delim != NULL");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::operator<<(poVar4,"\n");
  }
  else {
    if (result != (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
      cVar1 = *delim;
      if ((cVar1 == '\0') || (delim[1] != '\0')) {
        lVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim);
        while (lVar2 != -1) {
          lVar2 = std::__cxx11::string::find_first_of((char *)full,(ulong)delim);
          if (lVar2 == -1) {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)full);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)result,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            return;
          }
          std::__cxx11::string::substr((ulong)&local_70,(ulong)full);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)result,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          lVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim);
        }
      }
      else {
        pcVar5 = (full->_M_dataplus)._M_p;
        pcVar6 = pcVar5 + full->_M_string_length;
        while (pcVar5 != pcVar6) {
          pcVar3 = pcVar5;
          if (*pcVar5 == cVar1) {
            pcVar5 = pcVar5 + 1;
          }
          else {
            do {
              pcVar3 = pcVar3 + 1;
              pcVar7 = pcVar6;
              if (pcVar3 == pcVar6) break;
              pcVar7 = pcVar3;
            } while (*pcVar3 != cVar1);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar5,pcVar7);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)result,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            pcVar5 = pcVar7;
          }
        }
      }
      return;
    }
    local_74.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,&local_75);
    std::__cxx11::string::string((string *)&local_50,"SplitStringToSetUsing",&local_76);
    poVar4 = Logger::Start(ERR,&local_70,0x3f,&local_50);
    poVar4 = std::operator<<(poVar4,"CHECK failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3f);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"result != NULL");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_74);
  abort();
}

Assistant:

void SplitStringToSetUsing(const std::string& full,
                           const char* delim,
                           std::set<std::string>* result) {
  CHECK(delim != NULL);
  CHECK(result != NULL);
  simple_insert_iterator<std::set<std::string> > it(result);
  SplitStringToIteratorUsing(full, delim, it);
}